

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLString.cpp
# Opt level: O1

String * MathML::StringUtil::replaceAll
                   (String *__return_storage_ptr__,String *str,String *pattern,String *replacement)

{
  pointer pcVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + str->_M_string_length);
  while( true ) {
    uVar2 = std::__cxx11::string::find
                      ((char *)__return_storage_ptr__,(ulong)(pattern->_M_dataplus)._M_p,0);
    if (uVar2 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace
              ((ulong)__return_storage_ptr__,uVar2,(char *)pattern->_M_string_length,
               (ulong)(replacement->_M_dataplus)._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

String StringUtil::replaceAll( const String& str, const String& pattern, const String& replacement )
    {
        String string = str;

        size_t position = string.find( pattern );

        while ( position != String::npos )
        {
            string.replace( position, pattern.size(), replacement );
            position = string.find( pattern );
        }

        return string;
    }